

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort.cpp
# Opt level: O0

void mergesort_4way_parallel(uchar **strings,size_t n,uchar **tmp)

{
  ulong n_00;
  ulong uVar1;
  long lVar2;
  size_t split2;
  size_t split1;
  size_t split0;
  uchar **tmp_local;
  size_t n_local;
  uchar **strings_local;
  
  if (n < 0x20) {
    insertion_sort(strings,(int)n,0);
  }
  else {
    n_00 = n >> 2;
    uVar1 = n >> 1;
    lVar2 = n_00 + uVar1;
    mergesort_4way_parallel(strings,n_00,tmp);
    mergesort_4way_parallel(strings + n_00,uVar1 - n_00,tmp + n_00);
    mergesort_4way_parallel(strings + uVar1,lVar2 - uVar1,tmp + uVar1);
    mergesort_4way_parallel(strings + lVar2,n - lVar2,tmp + lVar2);
    merge_4way(strings,n_00,strings + n_00,uVar1 - n_00,strings + uVar1,lVar2 - uVar1,
               strings + lVar2,n - lVar2,tmp);
    memcpy(strings,tmp,n << 3);
  }
  return;
}

Assistant:

void
mergesort_4way_parallel(unsigned char** strings, size_t n, unsigned char** tmp)
{
	debug() << __func__ << "(), n="<<n<<"\n";
	if (n < 32) {
		insertion_sort(strings, n, 0);
		return;
	}
	const size_t split0 = n/4,
	             split1 = n/2,
	             split2 = split0+split1;
#pragma omp parallel sections
	{
#pragma omp section
		mergesort_4way_parallel(strings,        split0,        tmp);
#pragma omp section
		mergesort_4way_parallel(strings+split0, split1-split0, tmp+split0);
#pragma omp section
		mergesort_4way_parallel(strings+split1, split2-split1, tmp+split1);
#pragma omp section
		mergesort_4way_parallel(strings+split2, n-split2,      tmp+split2);
	}
	merge_4way(strings,        split0,
	           strings+split0, split1-split0,
	           strings+split1, split2-split1,
	           strings+split2, n-split2,
	           tmp);
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
}